

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O1

void __thiscall Assimp::D3DS::Material::Material(Material *this,Material *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  aiTextureMapMode aVar4;
  bool bVar5;
  undefined3 uVar6;
  int iVar7;
  ai_real aVar8;
  ai_real aVar9;
  ai_real aVar10;
  ai_real aVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  
  this->_vptr_Material = (_func_int **)&PTR__Material_007fe7a8;
  paVar1 = &(this->mName).field_2;
  (this->mName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (other->mName)._M_dataplus._M_p;
  paVar12 = &(other->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar12) {
    uVar3 = *(undefined8 *)((long)&(other->mName).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mName).field_2 + 8) = uVar3;
  }
  else {
    (this->mName)._M_dataplus._M_p = pcVar2;
    (this->mName).field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  (this->mName)._M_string_length = (other->mName)._M_string_length;
  (other->mName)._M_dataplus._M_p = (pointer)paVar12;
  (other->mName)._M_string_length = 0;
  (other->mName).field_2._M_local_buf[0] = '\0';
  (this->mDiffuse).r = (other->mDiffuse).r;
  (this->mDiffuse).g = (other->mDiffuse).g;
  (this->mDiffuse).b = (other->mDiffuse).b;
  this->mSpecularExponent = other->mSpecularExponent;
  this->mShininessStrength = other->mShininessStrength;
  (this->mSpecular).r = (other->mSpecular).r;
  (this->mSpecular).g = (other->mSpecular).g;
  (this->mSpecular).b = (other->mSpecular).b;
  (this->mAmbient).r = (other->mAmbient).r;
  (this->mAmbient).g = (other->mAmbient).g;
  (this->mAmbient).b = (other->mAmbient).b;
  this->mShading = other->mShading;
  this->mTransparency = other->mTransparency;
  (this->sTexDiffuse).mTextureBlend = (other->sTexDiffuse).mTextureBlend;
  paVar1 = &(this->sTexDiffuse).mMapName.field_2;
  (this->sTexDiffuse).mMapName._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (other->sTexDiffuse).mMapName._M_dataplus._M_p;
  paVar12 = &(other->sTexDiffuse).mMapName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar12) {
    uVar3 = *(undefined8 *)((long)&(other->sTexDiffuse).mMapName.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->sTexDiffuse).mMapName.field_2 + 8) = uVar3;
  }
  else {
    (this->sTexDiffuse).mMapName._M_dataplus._M_p = pcVar2;
    (this->sTexDiffuse).mMapName.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  (this->sTexDiffuse).mMapName._M_string_length = (other->sTexDiffuse).mMapName._M_string_length;
  (other->sTexDiffuse).mMapName._M_dataplus._M_p = (pointer)paVar12;
  (other->sTexDiffuse).mMapName._M_string_length = 0;
  (other->sTexDiffuse).mMapName.field_2._M_local_buf[0] = '\0';
  aVar8 = (other->sTexDiffuse).mOffsetU;
  aVar9 = (other->sTexDiffuse).mOffsetV;
  aVar10 = (other->sTexDiffuse).mScaleU;
  aVar11 = (other->sTexDiffuse).mScaleV;
  aVar4 = (other->sTexDiffuse).mMapMode;
  bVar5 = (other->sTexDiffuse).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexDiffuse).field_0x41;
  iVar7 = (other->sTexDiffuse).iUVSrc;
  (this->sTexDiffuse).mRotation = (other->sTexDiffuse).mRotation;
  (this->sTexDiffuse).mMapMode = aVar4;
  (this->sTexDiffuse).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexDiffuse).field_0x41 = uVar6;
  (this->sTexDiffuse).iUVSrc = iVar7;
  (this->sTexDiffuse).mOffsetU = aVar8;
  (this->sTexDiffuse).mOffsetV = aVar9;
  (this->sTexDiffuse).mScaleU = aVar10;
  (this->sTexDiffuse).mScaleV = aVar11;
  (this->sTexOpacity).mTextureBlend = (other->sTexOpacity).mTextureBlend;
  paVar1 = &(this->sTexOpacity).mMapName.field_2;
  (this->sTexOpacity).mMapName._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (other->sTexOpacity).mMapName._M_dataplus._M_p;
  paVar12 = &(other->sTexOpacity).mMapName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar12) {
    uVar3 = *(undefined8 *)((long)&(other->sTexOpacity).mMapName.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->sTexOpacity).mMapName.field_2 + 8) = uVar3;
  }
  else {
    (this->sTexOpacity).mMapName._M_dataplus._M_p = pcVar2;
    (this->sTexOpacity).mMapName.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  (this->sTexOpacity).mMapName._M_string_length = (other->sTexOpacity).mMapName._M_string_length;
  (other->sTexOpacity).mMapName._M_dataplus._M_p = (pointer)paVar12;
  (other->sTexOpacity).mMapName._M_string_length = 0;
  (other->sTexOpacity).mMapName.field_2._M_local_buf[0] = '\0';
  aVar8 = (other->sTexOpacity).mOffsetU;
  aVar9 = (other->sTexOpacity).mOffsetV;
  aVar10 = (other->sTexOpacity).mScaleU;
  aVar11 = (other->sTexOpacity).mScaleV;
  aVar4 = (other->sTexOpacity).mMapMode;
  bVar5 = (other->sTexOpacity).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexOpacity).field_0x41;
  iVar7 = (other->sTexOpacity).iUVSrc;
  (this->sTexOpacity).mRotation = (other->sTexOpacity).mRotation;
  (this->sTexOpacity).mMapMode = aVar4;
  (this->sTexOpacity).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexOpacity).field_0x41 = uVar6;
  (this->sTexOpacity).iUVSrc = iVar7;
  (this->sTexOpacity).mOffsetU = aVar8;
  (this->sTexOpacity).mOffsetV = aVar9;
  (this->sTexOpacity).mScaleU = aVar10;
  (this->sTexOpacity).mScaleV = aVar11;
  (this->sTexSpecular).mTextureBlend = (other->sTexSpecular).mTextureBlend;
  paVar1 = &(this->sTexSpecular).mMapName.field_2;
  (this->sTexSpecular).mMapName._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (other->sTexSpecular).mMapName._M_dataplus._M_p;
  paVar12 = &(other->sTexSpecular).mMapName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar12) {
    uVar3 = *(undefined8 *)((long)&(other->sTexSpecular).mMapName.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->sTexSpecular).mMapName.field_2 + 8) = uVar3;
  }
  else {
    (this->sTexSpecular).mMapName._M_dataplus._M_p = pcVar2;
    (this->sTexSpecular).mMapName.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  (this->sTexSpecular).mMapName._M_string_length = (other->sTexSpecular).mMapName._M_string_length;
  (other->sTexSpecular).mMapName._M_dataplus._M_p = (pointer)paVar12;
  (other->sTexSpecular).mMapName._M_string_length = 0;
  (other->sTexSpecular).mMapName.field_2._M_local_buf[0] = '\0';
  aVar8 = (other->sTexSpecular).mOffsetU;
  aVar9 = (other->sTexSpecular).mOffsetV;
  aVar10 = (other->sTexSpecular).mScaleU;
  aVar11 = (other->sTexSpecular).mScaleV;
  aVar4 = (other->sTexSpecular).mMapMode;
  bVar5 = (other->sTexSpecular).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexSpecular).field_0x41;
  iVar7 = (other->sTexSpecular).iUVSrc;
  (this->sTexSpecular).mRotation = (other->sTexSpecular).mRotation;
  (this->sTexSpecular).mMapMode = aVar4;
  (this->sTexSpecular).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexSpecular).field_0x41 = uVar6;
  (this->sTexSpecular).iUVSrc = iVar7;
  (this->sTexSpecular).mOffsetU = aVar8;
  (this->sTexSpecular).mOffsetV = aVar9;
  (this->sTexSpecular).mScaleU = aVar10;
  (this->sTexSpecular).mScaleV = aVar11;
  (this->sTexReflective).mTextureBlend = (other->sTexReflective).mTextureBlend;
  paVar1 = &(this->sTexReflective).mMapName.field_2;
  (this->sTexReflective).mMapName._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (other->sTexReflective).mMapName._M_dataplus._M_p;
  paVar12 = &(other->sTexReflective).mMapName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar12) {
    uVar3 = *(undefined8 *)((long)&(other->sTexReflective).mMapName.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->sTexReflective).mMapName.field_2 + 8) = uVar3;
  }
  else {
    (this->sTexReflective).mMapName._M_dataplus._M_p = pcVar2;
    (this->sTexReflective).mMapName.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  (this->sTexReflective).mMapName._M_string_length =
       (other->sTexReflective).mMapName._M_string_length;
  (other->sTexReflective).mMapName._M_dataplus._M_p = (pointer)paVar12;
  (other->sTexReflective).mMapName._M_string_length = 0;
  (other->sTexReflective).mMapName.field_2._M_local_buf[0] = '\0';
  aVar8 = (other->sTexReflective).mOffsetU;
  aVar9 = (other->sTexReflective).mOffsetV;
  aVar10 = (other->sTexReflective).mScaleU;
  aVar11 = (other->sTexReflective).mScaleV;
  aVar4 = (other->sTexReflective).mMapMode;
  bVar5 = (other->sTexReflective).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexReflective).field_0x41;
  iVar7 = (other->sTexReflective).iUVSrc;
  (this->sTexReflective).mRotation = (other->sTexReflective).mRotation;
  (this->sTexReflective).mMapMode = aVar4;
  (this->sTexReflective).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexReflective).field_0x41 = uVar6;
  (this->sTexReflective).iUVSrc = iVar7;
  (this->sTexReflective).mOffsetU = aVar8;
  (this->sTexReflective).mOffsetV = aVar9;
  (this->sTexReflective).mScaleU = aVar10;
  (this->sTexReflective).mScaleV = aVar11;
  (this->sTexBump).mTextureBlend = (other->sTexBump).mTextureBlend;
  paVar1 = &(this->sTexBump).mMapName.field_2;
  (this->sTexBump).mMapName._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (other->sTexBump).mMapName._M_dataplus._M_p;
  paVar12 = &(other->sTexBump).mMapName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar12) {
    uVar3 = *(undefined8 *)((long)&(other->sTexBump).mMapName.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->sTexBump).mMapName.field_2 + 8) = uVar3;
  }
  else {
    (this->sTexBump).mMapName._M_dataplus._M_p = pcVar2;
    (this->sTexBump).mMapName.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  (this->sTexBump).mMapName._M_string_length = (other->sTexBump).mMapName._M_string_length;
  (other->sTexBump).mMapName._M_dataplus._M_p = (pointer)paVar12;
  (other->sTexBump).mMapName._M_string_length = 0;
  (other->sTexBump).mMapName.field_2._M_local_buf[0] = '\0';
  aVar8 = (other->sTexBump).mOffsetU;
  aVar9 = (other->sTexBump).mOffsetV;
  aVar10 = (other->sTexBump).mScaleU;
  aVar11 = (other->sTexBump).mScaleV;
  aVar4 = (other->sTexBump).mMapMode;
  bVar5 = (other->sTexBump).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexBump).field_0x41;
  iVar7 = (other->sTexBump).iUVSrc;
  (this->sTexBump).mRotation = (other->sTexBump).mRotation;
  (this->sTexBump).mMapMode = aVar4;
  (this->sTexBump).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexBump).field_0x41 = uVar6;
  (this->sTexBump).iUVSrc = iVar7;
  (this->sTexBump).mOffsetU = aVar8;
  (this->sTexBump).mOffsetV = aVar9;
  (this->sTexBump).mScaleU = aVar10;
  (this->sTexBump).mScaleV = aVar11;
  (this->sTexEmissive).mTextureBlend = (other->sTexEmissive).mTextureBlend;
  paVar1 = &(this->sTexEmissive).mMapName.field_2;
  (this->sTexEmissive).mMapName._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (other->sTexEmissive).mMapName._M_dataplus._M_p;
  paVar12 = &(other->sTexEmissive).mMapName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar12) {
    uVar3 = *(undefined8 *)((long)&(other->sTexEmissive).mMapName.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->sTexEmissive).mMapName.field_2 + 8) = uVar3;
  }
  else {
    (this->sTexEmissive).mMapName._M_dataplus._M_p = pcVar2;
    (this->sTexEmissive).mMapName.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  (this->sTexEmissive).mMapName._M_string_length = (other->sTexEmissive).mMapName._M_string_length;
  (other->sTexEmissive).mMapName._M_dataplus._M_p = (pointer)paVar12;
  (other->sTexEmissive).mMapName._M_string_length = 0;
  (other->sTexEmissive).mMapName.field_2._M_local_buf[0] = '\0';
  aVar8 = (other->sTexEmissive).mOffsetU;
  aVar9 = (other->sTexEmissive).mOffsetV;
  aVar10 = (other->sTexEmissive).mScaleU;
  aVar11 = (other->sTexEmissive).mScaleV;
  aVar4 = (other->sTexEmissive).mMapMode;
  bVar5 = (other->sTexEmissive).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexEmissive).field_0x41;
  iVar7 = (other->sTexEmissive).iUVSrc;
  (this->sTexEmissive).mRotation = (other->sTexEmissive).mRotation;
  (this->sTexEmissive).mMapMode = aVar4;
  (this->sTexEmissive).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexEmissive).field_0x41 = uVar6;
  (this->sTexEmissive).iUVSrc = iVar7;
  (this->sTexEmissive).mOffsetU = aVar8;
  (this->sTexEmissive).mOffsetV = aVar9;
  (this->sTexEmissive).mScaleU = aVar10;
  (this->sTexEmissive).mScaleV = aVar11;
  (this->sTexShininess).mTextureBlend = (other->sTexShininess).mTextureBlend;
  paVar1 = &(this->sTexShininess).mMapName.field_2;
  (this->sTexShininess).mMapName._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (other->sTexShininess).mMapName._M_dataplus._M_p;
  paVar12 = &(other->sTexShininess).mMapName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar12) {
    uVar3 = *(undefined8 *)((long)&(other->sTexShininess).mMapName.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->sTexShininess).mMapName.field_2 + 8) = uVar3;
  }
  else {
    (this->sTexShininess).mMapName._M_dataplus._M_p = pcVar2;
    (this->sTexShininess).mMapName.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  (this->sTexShininess).mMapName._M_string_length = (other->sTexShininess).mMapName._M_string_length
  ;
  (other->sTexShininess).mMapName._M_dataplus._M_p = (pointer)paVar12;
  (other->sTexShininess).mMapName._M_string_length = 0;
  (other->sTexShininess).mMapName.field_2._M_local_buf[0] = '\0';
  aVar8 = (other->sTexShininess).mOffsetU;
  aVar9 = (other->sTexShininess).mOffsetV;
  aVar10 = (other->sTexShininess).mScaleU;
  aVar11 = (other->sTexShininess).mScaleV;
  aVar4 = (other->sTexShininess).mMapMode;
  bVar5 = (other->sTexShininess).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexShininess).field_0x41;
  iVar7 = (other->sTexShininess).iUVSrc;
  (this->sTexShininess).mRotation = (other->sTexShininess).mRotation;
  (this->sTexShininess).mMapMode = aVar4;
  (this->sTexShininess).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexShininess).field_0x41 = uVar6;
  (this->sTexShininess).iUVSrc = iVar7;
  (this->sTexShininess).mOffsetU = aVar8;
  (this->sTexShininess).mOffsetV = aVar9;
  (this->sTexShininess).mScaleU = aVar10;
  (this->sTexShininess).mScaleV = aVar11;
  this->mBumpHeight = other->mBumpHeight;
  (this->mEmissive).r = (other->mEmissive).r;
  (this->mEmissive).g = (other->mEmissive).g;
  (this->mEmissive).b = (other->mEmissive).b;
  (this->sTexAmbient).mTextureBlend = (other->sTexAmbient).mTextureBlend;
  paVar1 = &(this->sTexAmbient).mMapName.field_2;
  (this->sTexAmbient).mMapName._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (other->sTexAmbient).mMapName._M_dataplus._M_p;
  paVar12 = &(other->sTexAmbient).mMapName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar12) {
    uVar3 = *(undefined8 *)((long)&(other->sTexAmbient).mMapName.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->sTexAmbient).mMapName.field_2 + 8) = uVar3;
  }
  else {
    (this->sTexAmbient).mMapName._M_dataplus._M_p = pcVar2;
    (this->sTexAmbient).mMapName.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  (this->sTexAmbient).mMapName._M_string_length = (other->sTexAmbient).mMapName._M_string_length;
  (other->sTexAmbient).mMapName._M_dataplus._M_p = (pointer)paVar12;
  (other->sTexAmbient).mMapName._M_string_length = 0;
  (other->sTexAmbient).mMapName.field_2._M_local_buf[0] = '\0';
  aVar8 = (other->sTexAmbient).mOffsetU;
  aVar9 = (other->sTexAmbient).mOffsetV;
  aVar10 = (other->sTexAmbient).mScaleU;
  aVar11 = (other->sTexAmbient).mScaleV;
  aVar4 = (other->sTexAmbient).mMapMode;
  bVar5 = (other->sTexAmbient).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexAmbient).field_0x41;
  iVar7 = (other->sTexAmbient).iUVSrc;
  (this->sTexAmbient).mRotation = (other->sTexAmbient).mRotation;
  (this->sTexAmbient).mMapMode = aVar4;
  (this->sTexAmbient).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexAmbient).field_0x41 = uVar6;
  (this->sTexAmbient).iUVSrc = iVar7;
  (this->sTexAmbient).mOffsetU = aVar8;
  (this->sTexAmbient).mOffsetV = aVar9;
  (this->sTexAmbient).mScaleU = aVar10;
  (this->sTexAmbient).mScaleV = aVar11;
  this->mTwoSided = other->mTwoSided;
  return;
}

Assistant:

Material(Material &&other) AI_NO_EXCEPT
    : mName(std::move(other.mName))
    , mDiffuse(std::move(other.mDiffuse))
    , mSpecularExponent(std::move(other.mSpecularExponent))
    , mShininessStrength(std::move(other.mShininessStrength))
    , mSpecular(std::move(other.mSpecular))
    , mAmbient(std::move(other.mAmbient))
    , mShading(std::move(other.mShading))
    , mTransparency(std::move(other.mTransparency))
    , sTexDiffuse(std::move(other.sTexDiffuse))
    , sTexOpacity(std::move(other.sTexOpacity))
    , sTexSpecular(std::move(other.sTexSpecular))
    , sTexReflective(std::move(other.sTexReflective))
    , sTexBump(std::move(other.sTexBump))
    , sTexEmissive(std::move(other.sTexEmissive))
    , sTexShininess(std::move(other.sTexShininess))
    , mBumpHeight(std::move(other.mBumpHeight))
    , mEmissive(std::move(other.mEmissive))
    , sTexAmbient(std::move(other.sTexAmbient))
    , mTwoSided(std::move(other.mTwoSided))
    {
    }